

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

int __thiscall
fmp4_stream::ingest_stream::write_init_to_file
          (ingest_stream *this,string *ofile,uint nfrags,bool write_sep_files)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *poVar5;
  uint local_4ec;
  undefined1 local_4e8 [4];
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segment_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  char local_470 [8];
  ofstream out_file_1;
  uint local_270;
  uint k_1;
  uint chunk_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> init_data_1;
  undefined1 local_248 [4];
  uint k;
  vector<unsigned_char,_std::allocator<unsigned_char>_> init_data;
  char local_220 [8];
  ofstream out_file;
  bool write_sep_files_local;
  uint nfrags_local;
  string *ofile_local;
  ingest_stream *this_local;
  
  if (write_sep_files) {
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
    get_init_segment_data(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
    for (local_270 = 0; local_270 < nfrags; local_270 = local_270 + 4) {
      std::__cxx11::to_string
                ((string *)
                 &segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_270 >> 2);
      std::operator+(&local_4b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"_");
      std::operator+(&local_490,&local_4b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ofile);
      std::ofstream::ofstream(local_470,(string *)&local_490,_S_bin);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string
                ((string *)
                 &segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) != 0) {
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
        Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
        std::ostream::write(local_470,(long)puVar2);
        for (local_4ec = 0; local_4ec < 4; local_4ec = local_4ec + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
          get_media_segment_data
                    (this,(ulong)(local_4ec + local_270 * 4),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
          puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
          Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
          std::ostream::write(local_470,(long)puVar2);
        }
        std::ofstream::close();
      }
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
      std::ofstream::~ofstream(local_470);
    }
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
  }
  else {
    std::ofstream::ofstream(local_220,(string *)ofile,_S_bin);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout," error writing stream to file ");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
      get_init_segment_data(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248)
      ;
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
      std::ostream::write(local_220,(long)puVar2);
      for (init_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          init_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < nfrags;
          init_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               init_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        uVar3 = (ulong)init_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        sVar4 = std::
                vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
                size(&this->media_fragment_);
        if (uVar3 < sVar4) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
          get_media_segment_data
                    (this,(ulong)init_data_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
          puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
          Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
          std::ostream::write(local_220,(long)puVar2);
        }
      }
      std::ofstream::close();
      poVar5 = std::operator<<((ostream *)&std::cout," done written init segment to file: ");
      poVar5 = std::operator<<(poVar5,(string *)ofile);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
    }
    std::ofstream::~ofstream(local_220);
  }
  return 0;
}

Assistant:

int ingest_stream::write_init_to_file(
		std::string &ofile, 
		unsigned int nfrags, 
		bool write_sep_files)
	{
		// write the stream to an output file
		if (!write_sep_files) {
			std::ofstream out_file(ofile, std::ofstream::binary);

			if (out_file.good())
			{
				std::vector<uint8_t> init_data;
				get_init_segment_data(init_data);
				out_file.write((char *)init_data.data(), init_data.size());
				for (unsigned int k = 0; k < nfrags; k++) {
					if (k < media_fragment_.size()) {
						init_data.clear();
						get_media_segment_data(k, init_data);
						out_file.write((char *)init_data.data(), init_data.size());
					}
				}
				out_file.close();
				std::cout << " done written init segment to file: " << ofile << std::endl;
			}
			else
			{
				std::cout << " error writing stream to file " << std::endl;
			}
		}
		else 
		{
			std::vector<uint8_t> init_data;
			get_init_segment_data(init_data);
			const unsigned int chunk_count=4;
			for (unsigned int k = 0; k < nfrags; k+=chunk_count) 
			{
				std::ofstream out_file( std::to_string(k/chunk_count) + "_" + ofile, std::ofstream::binary);
				std::vector<uint8_t> segment_data;
				if (out_file.good())
				{
					out_file.write((char *)init_data.data(), init_data.size());
					for (unsigned int i = 0; i < chunk_count; i++) {
						segment_data.clear();
						get_media_segment_data(k*chunk_count + i, segment_data);
						out_file.write((char *)segment_data.data(), segment_data.size());
					}
					out_file.close();
				}
			}
		}
		return 0;
	}